

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Performance::anon_unknown_1::ThresholdComparer<unsigned_long>::operator()
          (ThresholdComparer<unsigned_long> *this,unsigned_long *a,unsigned_long *b)

{
  float fVar1;
  float local_68;
  float local_5c;
  float local_50;
  float local_44;
  float local_30;
  float diff;
  unsigned_long *b_local;
  unsigned_long *a_local;
  ThresholdComparer<unsigned_long> *this_local;
  
  local_30 = (float)*a;
  local_44 = (float)*b;
  fVar1 = de::abs<float>(local_30 - local_44);
  local_50 = (float)this->absoluteThreshold;
  if (local_50 < fVar1) {
    local_5c = (float)*a;
    if ((fVar1 <= local_5c * this->relativeThreshold) ||
       (local_68 = (float)*b, fVar1 <= local_68 * this->relativeThreshold)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = *a < *b;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const T& a, const T& b) const
	{
		const float diff = de::abs((float)a - (float)b);

		// thresholds
		if (diff <= (float)absoluteThreshold)
			return false;
		if (diff <= float(a)*relativeThreshold ||
			diff <= float(b)*relativeThreshold)
			return false;

		// cmp
		return a < b;
	}